

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O3

void b_array::split<Map::Pair<std::__cxx11::string,MultiMap::MultiMap<std::__cxx11::string,long>>>
               (Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                *data1,size_t *size1,
               Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               *data2,size_t *size2)

{
  ulong uVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *pPVar2;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *pPVar3;
  ulong uVar4;
  size_t index;
  size_t sVar5;
  
  uVar1 = *size1;
  uVar4 = uVar1 + 1 >> 1;
  sVar5 = uVar1 - uVar4;
  if (uVar4 <= uVar1 && sVar5 != 0) {
    index = 0;
    do {
      pPVar2 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::operator[](data1,uVar4 + index);
      pPVar3 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MultiMap::MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
               ::operator[](data2,index);
      std::__cxx11::string::_M_assign((string *)pPVar3);
      BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
      ::operator=(&(pPVar3->value).tree,&(pPVar2->value).tree);
      index = index + 1;
    } while (sVar5 != index);
  }
  *size1 = uVar4;
  *size2 = sVar5;
  return;
}

Assistant:

void split(b_array::Array<T>& data1, size_t& size1, b_array::Array<T>& data2, size_t& size2) {
    size_t size = size1;
    for (size_t i = ((size + 1) / 2); i < size; i++) {
        data2[i - ((size + 1) / 2)] = data1[i];
    }
    size1 = (size + 1) / 2;
    size2 = size - size1;
}